

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall ACSStringPool::ReadStrings(ACSStringPool *this,PNGHandle *png,DWORD id)

{
  char *pcVar1;
  uint uVar2;
  DWORD DVar3;
  FILE *file;
  PoolEntry *pPVar4;
  size_t len_00;
  char *local_348;
  char *str;
  DWORD local_338;
  uint bucketnum;
  uint h;
  int32_t poolsize;
  int32_t j;
  int32_t i;
  FPNGChunkArchive arc;
  size_t len;
  DWORD id_local;
  PNGHandle *png_local;
  ACSStringPool *this_local;
  
  Clear(this);
  uVar2 = M_FindPNGChunk(png,id);
  arc.Chunk._48_8_ = ZEXT48(uVar2);
  if (arc.Chunk._48_8_ != 0) {
    file = FileReader::GetFile(png->File);
    FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)&j,file,id,arc.Chunk._48_8_);
    local_348 = (char *)0x0;
    FArchive::operator<<((FArchive *)&j,(SDWORD *)&bucketnum);
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Resize(&this->Pool,bucketnum);
    poolsize = 0;
    h = FArchive::ReadCount((FArchive *)&j);
    while (-1 < (int)h) {
      for (; poolsize < (int)h; poolsize = poolsize + 1) {
        pPVar4 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                           (&this->Pool,(long)poolsize);
        pPVar4->Next = 0xfffffffe;
        pPVar4 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                           (&this->Pool,(long)poolsize);
        pPVar4->LockCount = 0;
      }
      FArchive::operator<<((FArchive *)&j,&local_348);
      pcVar1 = local_348;
      len_00 = strlen(local_348);
      local_338 = SuperFastHash(pcVar1,len_00);
      pcVar1 = local_348;
      str._4_4_ = local_338 % 0xfb;
      pPVar4 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                         (&this->Pool,(long)poolsize);
      FString::operator=(&pPVar4->Str,pcVar1);
      DVar3 = local_338;
      pPVar4 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                         (&this->Pool,(long)poolsize);
      pPVar4->Hash = DVar3;
      DVar3 = FArchive::ReadCount((FArchive *)&j);
      pPVar4 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                         (&this->Pool,(long)poolsize);
      pPVar4->LockCount = DVar3;
      uVar2 = this->PoolBuckets[str._4_4_];
      pPVar4 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                         (&this->Pool,(long)poolsize);
      pPVar4->Next = uVar2;
      this->PoolBuckets[str._4_4_] = poolsize;
      poolsize = poolsize + 1;
      h = FArchive::ReadCount((FArchive *)&j);
    }
    if ((local_348 != (char *)0x0) && (local_348 != (char *)0x0)) {
      operator_delete__(local_348);
    }
    FindFirstFreeEntry(this,0);
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)&j);
  }
  return;
}

Assistant:

void ACSStringPool::ReadStrings(PNGHandle *png, DWORD id)
{
	Clear();

	size_t len = M_FindPNGChunk(png, id);
	if (len != 0)
	{
		FPNGChunkArchive arc(png->File->GetFile(), id, len);
		int32_t i, j, poolsize;
		unsigned int h, bucketnum;
		char *str = NULL;

		arc << poolsize;

		Pool.Resize(poolsize);
		i = 0;
		j = arc.ReadCount();
		while (j >= 0)
		{
			// Mark skipped entries as free
			for (; i < j; ++i)
			{
				Pool[i].Next = FREE_ENTRY;
				Pool[i].LockCount = 0;
			}
			arc << str;
			h = SuperFastHash(str, strlen(str));
			bucketnum = h % NUM_BUCKETS;
			Pool[i].Str = str;
			Pool[i].Hash = h;
			Pool[i].LockCount = arc.ReadCount();
			Pool[i].Next = PoolBuckets[bucketnum];
			PoolBuckets[bucketnum] = i;
			i++;
			j = arc.ReadCount();
		}
		if (str != NULL)
		{
			delete[] str;
		}
		FindFirstFreeEntry(0);
	}
}